

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

error_info *
toml::detail::make_type_error<toml::type_config>
          (basic_value<toml::type_config> *v,string *fname,value_t ty)

{
  basic_value<toml::type_config> *in_RSI;
  basic_value<toml::type_config> *in_RDI;
  value_t in_stack_0000004f;
  string *in_stack_00000068;
  source_location *in_stack_00000070;
  string *in_stack_00000078;
  basic_value<toml::type_config> *this;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  
  this = in_RDI;
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  to_string_abi_cxx11_(in_stack_0000004f);
  std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  basic_value<toml::type_config>::location(in_RDI);
  basic_value<toml::type_config>::type(in_RSI);
  to_string_abi_cxx11_(in_stack_0000004f);
  std::operator+(in_stack_fffffffffffffeb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  make_error_info<>(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location((source_location *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return (error_info *)this;
}

Assistant:

error_info make_type_error(const basic_value<TC>& v, const std::string& fname, const value_t ty)
{
    return make_error_info(fname + ": bad_cast to " + to_string(ty),
        v.location(), "the actual type is " + to_string(v.type()));
}